

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateKotlinMembers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  string local_e0;
  string local_c0;
  ImmutableMessageGenerator local_a0;
  
  ClassNameResolver::GetKotlinFactoryName_abi_cxx11_
            ((string *)&local_a0,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetKotlinExtensionsClassName_abi_cxx11_
            (&local_e0,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_c0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::
  Print<char[15],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\npublic inline fun $camelcase_name$(block: $message_kt$.Dsl.() -> kotlin.Unit): $message$ =\n  $message_kt$.Dsl._create($message$.newBuilder()).apply { block() }._build()\n"
             ,(char (*) [15])"camelcase_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
             (char (*) [11])"message_kt",&local_e0,(char (*) [8])0x420c9a,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
       *)local_a0.super_MessageGenerator._vptr_MessageGenerator !=
      &local_a0.super_MessageGenerator.oneofs_) {
    operator_delete(local_a0.super_MessageGenerator._vptr_MessageGenerator);
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,"public object $name$Kt {\n",(char (*) [5])0x3f58c9,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((this->super_MessageGenerator).descriptor_ + 8));
  io::Printer::Indent(printer);
  (*(this->super_MessageGenerator)._vptr_MessageGenerator[7])(this,printer);
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar1 + 0x70)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      if (*(char *)(*(long *)(*(long *)(pDVar1 + 0x38) + 0x20 + lVar2) + 0x4b) == '\0') {
        ImmutableMessageGenerator
                  (&local_a0,(Descriptor *)(*(long *)(pDVar1 + 0x38) + lVar2),this->context_);
        GenerateKotlinMembers(&local_a0,printer);
        local_a0.super_MessageGenerator._vptr_MessageGenerator =
             (_func_int **)&PTR__ImmutableMessageGenerator_004de8e0;
        FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
        ~FieldGeneratorMap(&local_a0.field_generators_);
        local_a0.super_MessageGenerator._vptr_MessageGenerator =
             (_func_int **)&PTR__MessageGenerator_004de880;
        std::
        _Rb_tree<const_google::protobuf::OneofDescriptor_*,_const_google::protobuf::OneofDescriptor_*,_std::_Identity<const_google::protobuf::OneofDescriptor_*>,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
        ::~_Rb_tree(&local_a0.super_MessageGenerator.oneofs_._M_t);
      }
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0x88;
    } while (lVar3 < *(int *)(pDVar1 + 0x70));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateKotlinMembers(
    io::Printer* printer) const {
  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "public inline fun $camelcase_name$(block: $message_kt$.Dsl.() -> "
      "kotlin.Unit): "
      "$message$ "
      "=\n"
      "  $message_kt$.Dsl._create($message$.newBuilder()).apply { block() "
      "}._build()\n",
      "camelcase_name", name_resolver_->GetKotlinFactoryName(descriptor_),
      "message_kt", name_resolver_->GetKotlinExtensionsClassName(descriptor_),
      "message", name_resolver_->GetClassName(descriptor_, true));

  printer->Print("public object $name$Kt {\n", "name", descriptor_->name());
  printer->Indent();
  GenerateKotlinDsl(printer);
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
        .GenerateKotlinMembers(printer);
  }
  printer->Outdent();
  printer->Print("}\n");
}